

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

bool __thiscall
ctemplate::TemplateCache::ExpandNoLoad
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data,
          ExpandEmitter *expand_emitter)

{
  int iVar1;
  Mutex *pMVar2;
  RefcountedTemplate *this_00;
  bool bVar3;
  TemplateId TVar4;
  iterator iVar5;
  key_type local_40;
  
  TVar4 = TemplateString::GetGlobalId(filename);
  pMVar2 = this->mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + 1;
  if (iVar1 < 0) {
    __assert_fail("++mutex_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xef,"void ctemplate::Mutex::ReaderLock()");
  }
  if (this->is_frozen_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"DFATAL: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": ExpandNoLoad() only works on frozen caches.",0x2d);
  }
  else {
    local_40.first = TVar4;
    local_40.second = strip;
    iVar5 = std::
            _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->parsed_template_cache_->_M_h,&local_40);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
        ._M_cur != (__node_type *)0x0) {
      this_00 = *(RefcountedTemplate **)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                        ._M_cur + 0x18);
      RefcountedTemplate::IncRef(this_00);
      iVar1 = pMVar2->mutex_;
      pMVar2->mutex_ = iVar1 + -1;
      if (0 < iVar1) {
        bVar3 = Template::ExpandWithDataAndCache
                          (this_00->ptr_,expand_emitter,dict,per_expand_data,this);
        pMVar2 = this->mutex_;
        iVar1 = pMVar2->mutex_;
        pMVar2->mutex_ = pMVar2->mutex_ + -1;
        if (iVar1 != 0) {
          __assert_fail("--mutex_ == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                        ,0xea,"void ctemplate::Mutex::Lock()");
        }
        RefcountedTemplate::DecRefN(this_00,1);
        pMVar2->mutex_ = pMVar2->mutex_ + 1;
        if (pMVar2->mutex_ == 0) {
          return bVar3;
        }
        __assert_fail("mutex_++ == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                      ,0xeb,"void ctemplate::Mutex::Unlock()");
      }
      goto LAB_00121b41;
    }
  }
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + -1;
  if (0 < iVar1) {
    return false;
  }
LAB_00121b41:
  __assert_fail("mutex_-- > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xf0,"void ctemplate::Mutex::ReaderUnlock()");
}

Assistant:

bool TemplateCache::ExpandNoLoad(
    const TemplateString& filename,
    Strip strip,
    const TemplateDictionaryInterface *dict,
    PerExpandData *per_expand_data,
    ExpandEmitter *expand_emitter) const {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  CachedTemplate cached_tpl;
  {
    ReaderMutexLock ml(mutex_);
    if (!is_frozen_) {
      LOG(DFATAL) << ": ExpandNoLoad() only works on frozen caches.";
      return false;
    }
    CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
    if (!it) {
      return false;
    }
    cached_tpl = *it;
    cached_tpl.refcounted_tpl->IncRef();
  }
  const bool result = cached_tpl.refcounted_tpl->tpl()->ExpandWithDataAndCache(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    cached_tpl.refcounted_tpl->DecRef();
  }
  return result;
}